

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

void __thiscall
pstore::storage::storage<pstore::file::in_memory>
          (storage *this,shared_ptr<pstore::file::in_memory> *file,
          unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
          *page_size,
          unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
          *region_factory)

{
  factory *pfVar1;
  shared_ptr<pstore::file::file_base> sVar2;
  
  std::make_unique<std::array<pstore::sat_entry,65536ul>>();
  sVar2 = std::static_pointer_cast<pstore::file::file_base,pstore::file::in_memory>
                    ((shared_ptr<pstore::file::in_memory> *)&this->file_);
  (this->page_size_)._M_t.
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (page_size->_M_t).
       super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
       .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl;
  (page_size->_M_t).
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (system_page_size_interface *)0x0;
  (this->region_factory_)._M_t.
  super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>._M_t
  .super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
       (region_factory->_M_t).
       super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
       ._M_t.
       super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
       .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl;
  (region_factory->_M_t).
  super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>._M_t
  .super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl = (factory *)0x0;
  pfVar1 = (this->region_factory_)._M_t.
           super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>
           .super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl;
  (*pfVar1->_vptr_factory[2])
            (&this->regions_,pfVar1,
             sVar2.super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  return;
}

Assistant:

storage (std::shared_ptr<File> const & file,
                 std::unique_ptr<system_page_size_interface> && page_size,
                 std::unique_ptr<region::factory> && region_factory)
                : file_{std::static_pointer_cast<file::file_base> (file)}
                , page_size_{std::move (page_size)}
                , region_factory_{std::move (region_factory)}
                , regions_{region_factory_->init ()} {}